

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O2

MergeResult
mergesort_cache_lcp_2way_parallel<true,unsigned_char>
          (uchar **strings_input,uchar **strings_output,lcp_t *lcp_input,lcp_t *lcp_output,
          uchar *cache_input,uchar *cache_output,size_t n)

{
  lcp_t *lcp_output_00;
  uchar uVar1;
  MergeResult MVar2;
  MergeResult MVar3;
  lcp_t depth;
  lcp_t lVar4;
  uchar *puVar5;
  ptrdiff_t _Num;
  ulong uVar6;
  lcp_t *plVar7;
  uchar **ppuVar8;
  uchar **strings_input_00;
  size_t n_00;
  uint uVar9;
  uchar *cache_output_00;
  
  if (n < 0x20) {
    insertion_sort(strings_input,(int)n,(size_t)lcp_input);
    puVar5 = *strings_input;
    depth = lcp(puVar5,strings_input[1]);
    *lcp_input = depth;
    uVar1 = get_char<unsigned_char>(puVar5,0);
    *cache_input = uVar1;
    for (uVar9 = 2; uVar6 = (ulong)(uVar9 - 1), uVar6 < n - 1; uVar9 = uVar9 + 1) {
      puVar5 = strings_input[uVar6];
      lVar4 = lcp(puVar5,strings_input[uVar9]);
      lcp_input[uVar6] = lVar4;
      uVar1 = get_char<unsigned_char>(puVar5,depth);
      cache_input[uVar6] = uVar1;
      depth = lVar4;
    }
    uVar1 = get_char<unsigned_char>(strings_input[n - 1],lcp_input[n - 2]);
    cache_input[n - 1] = uVar1;
    check_input<unsigned_char>(strings_input,lcp_input,cache_input,n);
    return SortedInPlace;
  }
  uVar6 = n >> 1;
  MVar2 = mergesort_cache_lcp_2way_parallel<true,unsigned_char>
                    (strings_input,strings_output,lcp_input,lcp_output,cache_input,cache_output,
                     uVar6);
  puVar5 = cache_input;
  plVar7 = lcp_input;
  ppuVar8 = strings_input;
  if (MVar2 != SortedInPlace) {
    puVar5 = cache_output;
    plVar7 = lcp_output;
    ppuVar8 = strings_output;
  }
  check_input<unsigned_char>(ppuVar8,plVar7,puVar5,uVar6);
  strings_input_00 = strings_input + uVar6;
  ppuVar8 = strings_output + uVar6;
  plVar7 = lcp_input + uVar6;
  lcp_output_00 = lcp_output + uVar6;
  puVar5 = cache_input + uVar6;
  cache_output_00 = cache_output + uVar6;
  n_00 = n - uVar6;
  MVar3 = mergesort_cache_lcp_2way_parallel<true,unsigned_char>
                    (strings_input_00,ppuVar8,plVar7,lcp_output_00,puVar5,cache_output_00,n_00);
  if (MVar2 == SortedInPlace) {
    check_input<unsigned_char>(strings_input_00,plVar7,puVar5,n_00);
    if (MVar3 == SortedInPlace) {
      merge_cache_lcp_2way<true,unsigned_char>
                (strings_input,lcp_input,cache_input,uVar6,strings_input_00,plVar7,puVar5,n_00,
                 strings_output,lcp_output,cache_output);
      return SortedInTemp;
    }
    memmove(strings_output,strings_input,uVar6 * 8);
    memcpy(cache_output,cache_input,uVar6);
    memcpy(lcp_output,lcp_input,uVar6 * 8);
    MVar2 = SortedInTemp;
  }
  else {
    check_input<unsigned_char>(ppuVar8,lcp_output_00,cache_output_00,n_00);
    if (MVar2 == MVar3) goto LAB_001d1801;
    memmove(strings_input,strings_output,uVar6 * 8);
    memcpy(cache_input,cache_output,uVar6);
    memcpy(lcp_input,lcp_output,uVar6 * 8);
    MVar3 = SortedInTemp;
  }
  if (MVar2 != MVar3) {
    __assert_fail("m0 == m1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                  ,0x5e2,
                  "MergeResult mergesort_cache_lcp_2way_parallel(unsigned char **, unsigned char **, lcp_t *__restrict, lcp_t *__restrict, CharT *__restrict, CharT *__restrict, size_t) [OutputLCP = true, CharT = unsigned char]"
                 );
  }
LAB_001d1801:
  merge_cache_lcp_2way<true,unsigned_char>
            (strings_output,lcp_output,cache_output,uVar6,ppuVar8,lcp_output_00,cache_output_00,n_00
             ,strings_input,lcp_input,cache_input);
  return SortedInPlace;
}

Assistant:

MergeResult
mergesort_cache_lcp_2way_parallel(
              unsigned char** strings_input, unsigned char** strings_output,
              lcp_t* restrict lcp_input, lcp_t* restrict lcp_output,
              CharT* restrict cache_input, CharT* restrict cache_output,
              size_t n)
{
	debug() << __func__ << "(): n=" << n << '\n';
	if (n < 32) {
		insertion_sort(strings_input, n, 0);
		lcp_input[0] = lcp(strings_input[0], strings_input[1]);
		cache_input[0] = get_char<CharT>(strings_input[0], 0);
		for (unsigned i=1; i < n-1; ++i) {
			lcp_input[i] = lcp(strings_input[i], strings_input[i+1]);
			cache_input[i] = get_char<CharT>(strings_input[i], lcp_input[i-1]);
		}
		cache_input[n-1] = get_char<CharT>(strings_input[n-1], lcp_input[n-2]);
		check_input(strings_input, lcp_input, cache_input, n);
		return SortedInPlace;
	}
	const size_t split0 = n/2;
	MergeResult m0, m1;
	m0 = mergesort_cache_lcp_2way_parallel<true>(
			strings_input, strings_output,
			lcp_input, lcp_output,
			cache_input, cache_output,
			split0);

	if (m0==SortedInPlace) check_input(strings_input, lcp_input, cache_input, split0);
	else                   check_input(strings_output, lcp_output, cache_output, split0);

	m1 = mergesort_cache_lcp_2way_parallel<true>(
			strings_input+split0, strings_output+split0,
			lcp_input+split0, lcp_output+split0,
			cache_input+split0, cache_output+split0,
			n-split0);

	if (m0==SortedInPlace) check_input(strings_input+split0, lcp_input+split0, cache_input+split0, n-split0);
	else                   check_input(strings_output+split0, lcp_output+split0, cache_output+split0, n-split0);

	if (m0 != m1) {
		debug() << "Warning: extra copying due to m0 != m1. n="<<n<<"\n";
		if (m0 == SortedInPlace) {
			std::copy(strings_input, strings_input+split0,
					strings_output);
			std::copy(cache_input, cache_input+split0,
					cache_output);
			std::copy(lcp_input, lcp_input+split0,
					lcp_output);
			m0 = SortedInTemp;
		} else {
			std::copy(strings_output, strings_output+split0,
					strings_input);
			std::copy(cache_output, cache_output+split0,
					cache_input);
			std::copy(lcp_output, lcp_output+split0,
					lcp_input);
			m1 = SortedInTemp;
		}
	}
	assert(m0 == m1);
	if (m0 == SortedInPlace) {
		merge_cache_lcp_2way<OutputLCP>(
			strings_input, lcp_input, cache_input, split0,
			strings_input+split0, lcp_input+split0, cache_input+split0, n-split0,
			strings_output, lcp_output, cache_output);
		return SortedInTemp;
	} else {
		merge_cache_lcp_2way<OutputLCP>(
			strings_output, lcp_output, cache_output, split0,
			strings_output+split0, lcp_output+split0, cache_output+split0, n-split0,
			strings_input, lcp_input, cache_input);
		return SortedInPlace;
	}
}